

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

bool tcu::anon_unknown_3::pixelOnlyOnASharedEdge
               (IVec2 *pixel,SceneTriangle *triangle,IVec2 *viewportSize)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 uVar7;
  bool *pbVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vec2 triangleScreenSpace [3];
  Vec2 VStack_c8;
  Vec2 local_c0;
  Vec2 local_b8 [2];
  undefined1 local_a8 [16];
  Vector<float,_2> local_98;
  Vector<float,_2> local_90;
  Vector<float,_2> local_88;
  Vector<float,_2> local_80;
  Vector<float,_2> local_78;
  Vector<float,_2> local_70;
  Vector<float,_2> local_68;
  Vector<float,_2> local_60;
  Vector<float,_2> local_58;
  Vector<float,_2> local_50;
  Vector<float,_2> local_48;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  
  if (((triangle->sharedEdge[0] == false) && (triangle->sharedEdge[1] == false)) &&
     (triangle->sharedEdge[2] != true)) {
LAB_00988238:
    uVar7 = 0;
  }
  else {
    fVar3 = triangle->positions[0].m_data[3];
    auVar9._8_8_ = *(undefined8 *)triangle->positions[1].m_data;
    auVar9._0_8_ = *(undefined8 *)triangle->positions[0].m_data;
    fVar1 = triangle->positions[1].m_data[3];
    auVar11._4_4_ = fVar3;
    auVar11._0_4_ = fVar3;
    auVar11._8_4_ = fVar1;
    auVar11._12_4_ = fVar1;
    local_a8 = divps(auVar9,auVar11);
    fVar1 = triangle->positions[2].m_data[3];
    fVar3 = triangle->colors[0].m_data[0];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)triangle->positions[2].m_data;
    auVar2._4_4_ = fVar1;
    auVar2._0_4_ = fVar1;
    auVar2._8_4_ = fVar3;
    auVar2._12_4_ = fVar3;
    auVar11 = divps(auVar10,auVar2);
    local_98.m_data = auVar11._0_8_;
    local_68.m_data[0] = 1.0;
    local_68.m_data[1] = 1.0;
    tcu::operator+((Vector<float,_2> *)local_a8,&local_68);
    tcu::operator*(0.5,&local_40);
    local_70.m_data[1] = (float)(int)((ulong)*(undefined8 *)viewportSize->m_data >> 0x20);
    local_70.m_data[0] = (float)(int)*(undefined8 *)viewportSize->m_data;
    tcu::operator*(&local_38,&local_70);
    local_78.m_data[0] = 1.0;
    local_78.m_data[1] = 1.0;
    tcu::operator+((Vector<float,_2> *)(local_a8 + 8),&local_78);
    tcu::operator*(0.5,&local_50);
    local_80.m_data[1] = (float)(int)((ulong)*(undefined8 *)viewportSize->m_data >> 0x20);
    local_80.m_data[0] = (float)(int)*(undefined8 *)viewportSize->m_data;
    tcu::operator*(&local_48,&local_80);
    local_88.m_data[0] = 1.0;
    local_88.m_data[1] = 1.0;
    tcu::operator+(&local_98,&local_88);
    tcu::operator*(0.5,&local_60);
    local_90.m_data[1] = (float)(int)((ulong)*(undefined8 *)viewportSize->m_data >> 0x20);
    local_90.m_data[0] = (float)(int)*(undefined8 *)viewportSize->m_data;
    tcu::operator*(&local_58,&local_90);
    bVar4 = pixelNearLineSegment(pixel,&VStack_c8,&local_c0);
    bVar5 = pixelNearLineSegment(pixel,&local_c0,local_b8);
    bVar6 = pixelNearLineSegment(pixel,local_b8,&VStack_c8);
    if ((!bVar5 && !bVar6) && bVar4) {
      pbVar8 = triangle->sharedEdge;
    }
    else if ((!bVar4 && !bVar6) && bVar5) {
      pbVar8 = triangle->sharedEdge + 1;
    }
    else {
      if ((bVar4 || bVar5) || !bVar6) goto LAB_00988238;
      pbVar8 = triangle->sharedEdge + 2;
    }
    uVar7 = *pbVar8;
  }
  return (bool)uVar7;
}

Assistant:

bool pixelOnlyOnASharedEdge (const tcu::IVec2& pixel, const TriangleSceneSpec::SceneTriangle& triangle, const tcu::IVec2& viewportSize)
{
	if (triangle.sharedEdge[0] || triangle.sharedEdge[1] || triangle.sharedEdge[2])
	{
		const tcu::Vec2 triangleNormalizedDeviceSpace[3] =
		{
			tcu::Vec2(triangle.positions[0].x() / triangle.positions[0].w(), triangle.positions[0].y() / triangle.positions[0].w()),
			tcu::Vec2(triangle.positions[1].x() / triangle.positions[1].w(), triangle.positions[1].y() / triangle.positions[1].w()),
			tcu::Vec2(triangle.positions[2].x() / triangle.positions[2].w(), triangle.positions[2].y() / triangle.positions[2].w()),
		};
		const tcu::Vec2 triangleScreenSpace[3] =
		{
			(triangleNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
			(triangleNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
			(triangleNormalizedDeviceSpace[2] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
		};

		const bool pixelOnEdge0 = pixelNearLineSegment(pixel, triangleScreenSpace[0], triangleScreenSpace[1]);
		const bool pixelOnEdge1 = pixelNearLineSegment(pixel, triangleScreenSpace[1], triangleScreenSpace[2]);
		const bool pixelOnEdge2 = pixelNearLineSegment(pixel, triangleScreenSpace[2], triangleScreenSpace[0]);

		// If the pixel is on a multiple edges return false

		if (pixelOnEdge0 && !pixelOnEdge1 && !pixelOnEdge2)
			return triangle.sharedEdge[0];
		if (!pixelOnEdge0 && pixelOnEdge1 && !pixelOnEdge2)
			return triangle.sharedEdge[1];
		if (!pixelOnEdge0 && !pixelOnEdge1 && pixelOnEdge2)
			return triangle.sharedEdge[2];
	}

	return false;
}